

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O1

Gia_Man_t * Bac_ManExtract(Bac_Man_t *p,int fBuffers,int fVerbose)

{
  Bac_Ntk_t *p_00;
  byte bVar1;
  uint uVar2;
  int iVar3;
  Bac_Ntk_t *pBVar4;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  int *piVar7;
  Gia_Man_t *p_01;
  size_t sVar8;
  char *pcVar9;
  Gia_Obj_t *pGVar10;
  Vec_Int_t *pVVar11;
  Gia_Man_t *pGVar12;
  ulong uVar13;
  long lVar14;
  int nObjsMax;
  int iVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  ulong uVar22;
  bool bVar23;
  Bac_Ntk_t *local_58;
  
  iVar17 = p->iRoot;
  if (((long)iVar17 < 1) || (p->nNtks < iVar17)) {
    local_58 = (Bac_Ntk_t *)0x0;
  }
  else {
    local_58 = p->pNtks + iVar17;
  }
  (p->vBuf2LeafNtk).nSize = 0;
  (p->vBuf2LeafObj).nSize = 0;
  (p->vBuf2RootNtk).nSize = 0;
  (p->vBuf2RootObj).nSize = 0;
  iVar17 = p->nNtks;
  if (0 < iVar17) {
    lVar16 = 1;
    do {
      pBVar4 = p->pNtks;
      p_00 = pBVar4 + lVar16;
      uVar2 = pBVar4[lVar16].vType.nSize;
      if (pBVar4[lVar16].vIndex.nCap < (int)uVar2) {
        piVar7 = (p_00->vIndex).pArray;
        if (piVar7 == (int *)0x0) {
          piVar7 = (int *)malloc((long)(int)uVar2 << 2);
        }
        else {
          piVar7 = (int *)realloc(piVar7,(long)(int)uVar2 << 2);
        }
        (p_00->vIndex).pArray = piVar7;
        if (piVar7 == (int *)0x0) goto LAB_008b199c;
        (p_00->vIndex).nCap = uVar2;
      }
      if (0 < (int)uVar2) {
        memset((p_00->vIndex).pArray,0xff,(ulong)uVar2 * 4);
      }
      (p_00->vIndex).nSize = uVar2;
      if (0 < (p_00->vInputs).nSize) {
        lVar18 = 0;
        do {
          Bac_ObjSetIndex(p_00,(p_00->vInputs).pArray[lVar18],(int)lVar18);
          lVar18 = lVar18 + 1;
        } while (lVar18 < (p_00->vInputs).nSize);
      }
      if (0 < (p_00->vOutputs).nSize) {
        lVar18 = 0;
        do {
          Bac_ObjSetIndex(p_00,(p_00->vOutputs).pArray[lVar18],(int)lVar18);
          lVar18 = lVar18 + 1;
        } while (lVar18 < (p_00->vOutputs).nSize);
      }
      if (0 < (p_00->vType).nSize) {
        lVar18 = 1;
        uVar22 = 0xffffffffffffffff;
        lVar14 = 0;
        do {
          if (0xffffffbb < ((byte)(p_00->vType).pArray[lVar14] >> 1) - 0x49) {
            if (lVar14 != 0) {
              iVar17 = 0;
              uVar19 = uVar22;
              do {
                if ((p_00->vType).nSize < (int)uVar19 + 1) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                                ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
                }
                if (((p_00->vType).pArray[uVar19 & 0xffffffff] & 0xfeU) != 6) break;
                Bac_ObjSetIndex(p_00,(int)uVar19,iVar17);
                iVar17 = iVar17 + 1;
                bVar23 = uVar19 != 0;
                uVar19 = uVar19 - 1;
              } while (bVar23);
            }
            if (lVar14 + 1 < (long)(p_00->vType).nSize) {
              iVar17 = 0;
              lVar20 = lVar18;
              do {
                if (((p_00->vType).pArray[lVar20] & 0xfeU) != 8) break;
                Bac_ObjSetIndex(p_00,(int)lVar20,iVar17);
                iVar17 = iVar17 + 1;
                lVar20 = lVar20 + 1;
              } while ((int)lVar20 < (p_00->vType).nSize);
            }
          }
          lVar14 = lVar14 + 1;
          lVar18 = lVar18 + 1;
          uVar22 = uVar22 + 1;
        } while (lVar14 < (p_00->vType).nSize);
      }
      iVar17 = (p_00->vType).nCap;
      lVar18 = (long)iVar17;
      if (lVar18 == 0) {
        __assert_fail("Bac_NtkObjNumAlloc(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                      ,0xfe,"void Bac_NtkStartCopies(Bac_Ntk_t *)");
      }
      if ((p_00->vCopy).nCap < iVar17) {
        piVar7 = (p_00->vCopy).pArray;
        if (piVar7 == (int *)0x0) {
          piVar7 = (int *)malloc(lVar18 * 4);
        }
        else {
          piVar7 = (int *)realloc(piVar7,lVar18 * 4);
        }
        (p_00->vCopy).pArray = piVar7;
        if (piVar7 == (int *)0x0) {
LAB_008b199c:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (p_00->vCopy).nCap = iVar17;
      }
      if (0 < iVar17) {
        memset((p_00->vCopy).pArray,0xff,lVar18 << 2);
      }
      (p_00->vCopy).nSize = iVar17;
      iVar17 = p->nNtks;
      bVar23 = lVar16 < iVar17;
      lVar16 = lVar16 + 1;
    } while (bVar23);
  }
  if (iVar17 < 1) {
    nObjsMax = 0;
  }
  else {
    nObjsMax = 0;
    uVar22 = 1;
    do {
      iVar3 = p->pNtks[uVar22].vType.nSize;
      iVar15 = 0;
      if (0 < (long)iVar3) {
        lVar16 = 0;
        iVar15 = 0;
        do {
          bVar1 = p->pNtks[uVar22].vType.pArray[lVar16];
          if ((char)bVar1 < '\0') {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          iVar15 = iVar15 + (uint)(bVar1 < 10);
          lVar16 = lVar16 + 1;
        } while (iVar3 != lVar16);
      }
      nObjsMax = (nObjsMax + iVar3) - iVar15;
      uVar22 = uVar22 + 1;
    } while (uVar22 != iVar17 + 1);
  }
  p_01 = Gia_ManStart(nObjsMax);
  pcVar5 = p->pName;
  if (pcVar5 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar5);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar5);
  }
  p_01->pName = pcVar9;
  pcVar5 = p->pSpec;
  if (pcVar5 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar5);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar5);
  }
  p_01->pSpec = pcVar9;
  if (0 < (local_58->vInputs).nSize) {
    lVar16 = 0;
    do {
      uVar2 = (local_58->vInputs).pArray[lVar16];
      pGVar10 = Gia_ManAppendObj(p_01);
      uVar22 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar22 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar22 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar6 = p_01->pObjs;
      if ((pGVar10 < pGVar6) || (pGVar6 + p_01->nObjs <= pGVar10)) goto LAB_008b18e2;
      Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar6) >> 2) * -0x55555555);
      pGVar6 = p_01->pObjs;
      if ((pGVar10 < pGVar6) || (pGVar6 + p_01->nObjs <= pGVar10)) goto LAB_008b18e2;
      if (((int)uVar2 < 0) || ((local_58->vCopy).nSize <= (int)uVar2)) goto LAB_008b1901;
      if ((local_58->vCopy).pArray[uVar2] != -1) {
        __assert_fail("Bac_ObjCopy(p, i) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                      ,0x12d,"void Bac_ObjSetCopy(Bac_Ntk_t *, int, int)");
      }
      Vec_IntFillExtra(&local_58->vCopy,uVar2 + 1,0);
      if ((local_58->vCopy).nSize <= (int)uVar2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (local_58->vCopy).pArray[uVar2] =
           (int)((ulong)((long)pGVar10 - (long)pGVar6) >> 2) * 0x55555556;
      lVar16 = lVar16 + 1;
    } while (lVar16 < (local_58->vInputs).nSize);
  }
  Gia_ManHashAlloc(p_01);
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  pVVar11->nCap = 10000;
  pVVar11->nSize = 0;
  piVar7 = (int *)malloc(40000);
  pVVar11->pArray = piVar7;
  p_01->vBarBufs = pVVar11;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  pVVar11->nCap = 10000;
  pVVar11->nSize = 0;
  piVar7 = (int *)malloc(40000);
  pVVar11->pArray = piVar7;
  pVVar11->nSize = 10000;
  if (piVar7 != (int *)0x0) {
    memset(piVar7,0xff,40000);
  }
  Bac_ManPrepareGates(p);
  if (0 < (local_58->vOutputs).nSize) {
    lVar16 = 0;
    do {
      Bac_ManExtract_rec(p_01,local_58,(local_58->vOutputs).pArray[lVar16],fBuffers,pVVar11);
      lVar16 = lVar16 + 1;
    } while (lVar16 < (local_58->vOutputs).nSize);
  }
  Bac_ManUndoGates(p);
  if (pVVar11->pArray != (int *)0x0) {
    free(pVVar11->pArray);
    pVVar11->pArray = (int *)0x0;
  }
  free(pVVar11);
  Gia_ManHashStop(p_01);
  if (0 < (local_58->vOutputs).nSize) {
    lVar16 = 0;
    do {
      iVar17 = (local_58->vOutputs).pArray[lVar16];
      if (((long)iVar17 < 0) || ((local_58->vCopy).nSize <= iVar17)) {
LAB_008b1901:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar2 = (local_58->vCopy).pArray[iVar17];
      if ((int)uVar2 < 0) {
LAB_008b1920:
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      uVar21 = uVar2 >> 1;
      if (p_01->nObjs <= (int)uVar21) goto LAB_008b1920;
      if ((~*(uint *)(p_01->pObjs + uVar21) & 0x1fffffff) != 0 &&
          (int)*(uint *)(p_01->pObjs + uVar21) < 0) {
        __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x316,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      pGVar10 = Gia_ManAppendObj(p_01);
      uVar22 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar22 | 0x80000000;
      pGVar6 = p_01->pObjs;
      if ((pGVar10 < pGVar6) || (pGVar6 + p_01->nObjs <= pGVar10)) {
LAB_008b18e2:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar19 = (ulong)(((uint)((int)pGVar10 - (int)pGVar6) >> 2) * -0x55555555 - uVar21 & 0x1fffffff
                      );
      uVar13 = (ulong)((uVar2 & 1) << 0x1d);
      *(ulong *)pGVar10 = uVar13 | uVar22 & 0xffffffffc0000000 | 0x80000000 | uVar19;
      *(ulong *)pGVar10 =
           uVar13 | uVar22 & 0xe0000000c0000000 | 0x80000000 | uVar19 |
           (ulong)(p_01->vCos->nSize & 0x1fffffff) << 0x20;
      pGVar6 = p_01->pObjs;
      if ((pGVar10 < pGVar6) || (pGVar6 + p_01->nObjs <= pGVar10)) goto LAB_008b18e2;
      Vec_IntPush(p_01->vCos,(int)((ulong)((long)pGVar10 - (long)pGVar6) >> 2) * -0x55555555);
      if (p_01->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p_01,pGVar10 + -(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff),pGVar10)
        ;
      }
      if ((pGVar10 < p_01->pObjs) || (p_01->pObjs + p_01->nObjs <= pGVar10)) goto LAB_008b18e2;
      lVar16 = lVar16 + 1;
    } while (lVar16 < (local_58->vOutputs).nSize);
  }
  if ((p->vBuf2LeafNtk).nSize != p_01->nBufs) {
    __assert_fail("Vec_IntSize(&p->vBuf2LeafNtk) == pNew->nBufs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBlast.c"
                  ,0x101,"Gia_Man_t *Bac_ManExtract(Bac_Man_t *, int, int)");
  }
  pGVar12 = Gia_ManCleanup(p_01);
  Gia_ManStop(p_01);
  return pGVar12;
}

Assistant:

Gia_Man_t * Bac_ManExtract( Bac_Man_t * p, int fBuffers, int fVerbose )
{
    Bac_Ntk_t * pNtk, * pRoot = Bac_ManRoot(p);
    Gia_Man_t * pNew, * pTemp; 
    Vec_Int_t * vMap = NULL;
    int i, iObj;

    Vec_IntClear( &p->vBuf2LeafNtk );
    Vec_IntClear( &p->vBuf2LeafObj );
    Vec_IntClear( &p->vBuf2RootNtk );
    Vec_IntClear( &p->vBuf2RootObj );

    Bac_ManForEachNtk( p, pNtk, i )
    {
        Bac_NtkDeriveIndex( pNtk );
        Bac_NtkStartCopies( pNtk );
    }

    // start the manager
    pNew = Gia_ManStart( Bac_ManNodeNum(p) );
    pNew->pName = Abc_UtilStrsav(p->pName);
    pNew->pSpec = Abc_UtilStrsav(p->pSpec);

    // primary inputs
    Bac_NtkForEachPi( pRoot, iObj, i )
        Bac_ObjSetCopy( pRoot, iObj, Gia_ManAppendCi(pNew) );

    // internal nodes
    Gia_ManHashAlloc( pNew );
    pNew->vBarBufs = Vec_IntAlloc( 10000 );
    vMap = Vec_IntStartFull( 10000 );
    Bac_ManPrepareGates( p );
    Bac_NtkForEachPo( pRoot, iObj, i )
        Bac_ManExtract_rec( pNew, pRoot, iObj, fBuffers, vMap );
    Bac_ManUndoGates( p );
    Vec_IntFreeP( &vMap );
    Gia_ManHashStop( pNew );

    // primary outputs
    Bac_NtkForEachPo( pRoot, iObj, i )
        Gia_ManAppendCo( pNew, Bac_ObjCopy(pRoot, iObj) );
    assert( Vec_IntSize(&p->vBuf2LeafNtk) == pNew->nBufs );

    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    //Gia_ManPrintStats( pNew, NULL );
    return pNew;
}